

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void pre_out(c2m_ctx_t c2m_ctx,token_t t)

{
  char cVar1;
  VARR_token_t *pVVar2;
  token_t ptVar3;
  FILE *__stream;
  pos_t pVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  c2m_ctx_t pcVar11;
  token_t *__ptr;
  c2m_ctx_t pcVar12;
  byte *pbVar13;
  c2m_ctx_t pcVar14;
  void *__ptr_00;
  size_t sVar15;
  int *piVar16;
  node_t_conflict n;
  uint uVar17;
  int iVar18;
  MIR_context_t pMVar19;
  int extraout_EDX;
  MIR_context_t pMVar20;
  char *pcVar21;
  ulong uVar22;
  VARR_char *pVVar23;
  char *__s1;
  c2m_ctx_t pcVar24;
  int iVar25;
  undefined7 uVar26;
  c2m_ctx_t varr;
  c2m_ctx_t c2m_ctx_00;
  code *pcVar27;
  VARR_char *unaff_R12;
  c2m_ctx_t pcVar28;
  char *pcVar29;
  byte bVar30;
  VARR_char *unaff_R13;
  c2mir_options *__size;
  c2m_ctx_t pcVar31;
  long lVar32;
  size_t sVar33;
  bool bVar34;
  longdouble in_ST0;
  float fVar35;
  double dVar36;
  str_t sVar37;
  int iStack_dc;
  int *piStack_d8;
  uint uStack_d0;
  int iStack_cc;
  tab_str_t tStack_c0;
  c2m_ctx_t pcStack_a0;
  VARR_char *pVStack_98;
  VARR_char *pVStack_90;
  c2m_ctx_t pcStack_88;
  c2m_ctx_t pcStack_80;
  VARR_char *pVStack_78;
  c2m_ctx_t pcStack_68;
  c2m_ctx_t pcStack_60;
  c2m_ctx_t pcStack_58;
  VARR_char *pVStack_50;
  int local_44;
  long local_40;
  c2m_ctx_t local_38;
  
  if (t == (token_t)0x0) {
    ptVar3 = c2m_ctx->pre_ctx->pre_last_token;
    if (ptVar3 == (token_t)0x0) {
      lVar32 = -1;
      pcVar29 = (char *)0x0;
    }
    else {
      pcVar29 = (ptVar3->pos).fname;
      lVar32._0_4_ = (ptVar3->pos).lno;
      lVar32._4_4_ = (ptVar3->pos).ln_pos;
    }
    pVStack_50 = (VARR_char *)0x18fafb;
    pcVar11 = (c2m_ctx_t)reg_malloc(c2m_ctx,0x30);
    *(undefined4 *)&pcVar11->ctx = 0x13d;
    ((pos_t *)&pcVar11->options)->fname = pcVar29;
    pcVar11->env[0].__jmpbuf[0] = lVar32;
    pcVar11->env[0].__jmpbuf[3] = (long)"<EOF>";
    *(undefined4 *)(pcVar11->env[0].__jmpbuf + 1) = 0;
    pcVar11->env[0].__jmpbuf[2] = 0;
LAB_0018fb27:
    pVVar2 = c2m_ctx->recorded_tokens;
    __ptr = pVVar2->varr;
    if (__ptr != (token_t *)0x0) {
      sVar33 = pVVar2->els_num;
      uVar22 = sVar33 + 1;
      if (pVVar2->size < uVar22) {
        sVar33 = (uVar22 >> 1) + uVar22;
        pVStack_50 = (VARR_char *)0x18fb61;
        __ptr = (token_t *)realloc(__ptr,sVar33 * 8);
        pVVar2->varr = __ptr;
        pVVar2->size = sVar33;
        sVar33 = pVVar2->els_num;
        uVar22 = sVar33 + 1;
      }
      pVVar2->els_num = uVar22;
      __ptr[sVar33] = (token_t)pcVar11;
      return;
    }
    goto LAB_0018ff5b;
  }
  if ((*(short *)t == -1) || (*(short *)t == 0x147)) {
    pVStack_50 = (VARR_char *)0x18ff51;
    __assert_fail("t->code != T_EOU && t->code != EOF",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0xeda,"void pre_out(c2m_ctx_t, token_t)");
  }
  c2m_ctx->pre_ctx->pre_last_token = t;
  pVStack_50 = (VARR_char *)0x18f9f9;
  pcVar24 = c2m_ctx;
  pcVar11 = (c2m_ctx_t)pptoken2token(c2m_ctx,t,1);
  if (pcVar11 == (c2m_ctx_t)0x0) {
    return;
  }
  if (*(short *)&pcVar11->ctx != 0x102) goto LAB_0018fb27;
  pVVar2 = c2m_ctx->recorded_tokens;
  if (pVVar2 == (VARR_token_t *)0x0) goto LAB_0018ff60;
  sVar33 = pVVar2->els_num;
  if (sVar33 == 0) goto LAB_0018fb27;
  if (pVVar2->varr == (token_t *)0x0) goto LAB_0018ff6f;
  pcVar31 = (c2m_ctx_t)pVVar2->varr[sVar33 - 1];
  if (*(short *)&pcVar31->ctx != 0x102) goto LAB_0018fb27;
  pVVar2->els_num = sVar33 - 1;
  pVVar23 = c2m_ctx->temp_string;
  if ((pVVar23 != (VARR_char *)0x0) && (pVVar23->varr != (char *)0x0)) {
    pVVar23->els_num = 0;
    pbVar13 = (byte *)pcVar31->env[0].__jmpbuf[3];
    bVar30 = *pbVar13;
    uVar17 = (uint)bVar30;
    uVar26 = (undefined7)((ulong)pcVar24 >> 8);
    if ((bVar30 == 0x4c) || (bVar30 == 0x55)) {
LAB_0018fb86:
      pcVar24 = (c2m_ctx_t)pcVar11->env[0].__jmpbuf[3];
      pVVar23 = (VARR_char *)&DAT_00000001;
      bVar8 = *(byte *)&pcVar24->ctx;
      varr = (c2m_ctx_t)CONCAT71(uVar26,bVar8);
      if (bVar8 != 0x22) {
        bVar34 = true;
        if (bVar8 == bVar30) {
          bVar34 = *(char *)((long)&pcVar24->ctx + 1) == '8';
          varr = (c2m_ctx_t)(ulong)uVar17;
        }
LAB_0018fbca:
        if (((char)varr != 'L') && (uVar9 = (uint)varr & 0xff, uVar9 != 0x55)) {
          if (uVar9 == 0x75) goto LAB_0018fbe4;
          local_40 = 0;
          if (!bVar34) goto LAB_0018fc67;
          goto LAB_0018fc48;
        }
        goto LAB_0018fc0b;
      }
LAB_0018fb98:
      local_40 = 0;
LAB_0018fc67:
      local_44 = 0x4c;
      if (bVar30 != 0x4c) goto LAB_0018fc74;
LAB_0018fc8c:
      pcVar28 = (c2m_ctx_t)(pcVar11->env[0].__jmpbuf + 3);
      unaff_R13 = c2m_ctx->temp_string;
      pcVar12 = (c2m_ctx_t)unaff_R13->varr;
      if (pcVar12 != (c2m_ctx_t)0x0) {
        sVar33 = unaff_R13->els_num;
        uVar22 = sVar33 + 1;
        if (unaff_R13->size < uVar22) {
          pcVar28 = (c2m_ctx_t)((uVar22 >> 1) + uVar22);
          pVStack_50 = (VARR_char *)0x18fcc2;
          pcVar24 = pcVar28;
          varr = pcVar12;
          pcVar12 = (c2m_ctx_t)realloc(pcVar12,(size_t)pcVar28);
          unaff_R13->varr = (char *)pcVar12;
          unaff_R13->size = (size_t)pcVar28;
          sVar33 = unaff_R13->els_num;
          uVar22 = sVar33 + 1;
        }
        unaff_R13->els_num = uVar22;
        *(char *)((long)pcVar12->env[0].__jmpbuf + (sVar33 - 0x10)) = (char)local_44;
        pbVar13 = (byte *)pcVar31->env[0].__jmpbuf[3];
        goto LAB_0018fce6;
      }
LAB_0018ffbc:
      pVStack_50 = (VARR_char *)stringify;
      pre_out_cold_6();
      pcVar11 = c2m_ctx;
      pcVar12 = pcVar24;
      c2m_ctx_00 = varr;
      pcStack_68 = c2m_ctx;
      pcStack_60 = pcVar31;
      pcStack_58 = pcVar28;
      pVStack_50 = pVVar23;
      if ((pcVar24 != (c2m_ctx_t)0x0) &&
         (pcVar14 = (c2m_ctx_t)pcVar24->env[0].__jmpbuf[0], pcVar11 = pcVar24,
         pcVar14 != (c2m_ctx_t)0x0)) {
        pcVar24->ctx = (MIR_context_t)0x0;
        if (pcVar24->options == (c2mir_options *)0x0) {
          pcVar12 = (c2m_ctx_t)&DAT_00000001;
          pVStack_78 = (VARR_char *)0x190008;
          c2m_ctx_00 = pcVar14;
          pcVar14 = (c2m_ctx_t)realloc(pcVar14,1);
          pcVar24->env[0].__jmpbuf[0] = (long)pcVar14;
          pcVar24->options = (c2mir_options *)&DAT_00000001;
          pMVar19 = pcVar24->ctx;
          pMVar20 = (MIR_context_t)((long)&pMVar19->gen_ctx + 1);
        }
        else {
          pMVar20 = (MIR_context_t)&DAT_00000001;
          pMVar19 = (MIR_context_t)0x0;
        }
        pcVar24->ctx = pMVar20;
        *(undefined1 *)((long)&pMVar19->temp_ops + (long)(pcVar14->env + -1)) = 0x22;
        while( true ) {
          bVar30 = *(byte *)&varr->ctx;
          pVVar23 = (VARR_char *)(ulong)bVar30;
          pcVar31 = varr;
          if ((bVar30 == 0x22) || (bVar30 == 0x5c)) {
            pcVar14 = (c2m_ctx_t)pcVar24->env[0].__jmpbuf[0];
            if (pcVar14 == (c2m_ctx_t)0x0) goto LAB_0019011c;
            pMVar19 = pcVar24->ctx;
            pMVar20 = (MIR_context_t)((long)&pMVar19->gen_ctx + 1);
            if ((MIR_context_t)pcVar24->options < pMVar20) {
              pcVar28 = (c2m_ctx_t)((long)&pMVar20->gen_ctx + ((ulong)pMVar20 >> 1));
              pVStack_78 = (VARR_char *)0x190067;
              pcVar12 = pcVar28;
              c2m_ctx_00 = pcVar14;
              pcVar14 = (c2m_ctx_t)realloc(pcVar14,(size_t)pcVar28);
              pcVar24->env[0].__jmpbuf[0] = (long)pcVar14;
              pcVar24->options = (c2mir_options *)pcVar28;
              pMVar19 = pcVar24->ctx;
              pMVar20 = (MIR_context_t)((long)&pMVar19->gen_ctx + 1);
            }
            pcVar24->ctx = pMVar20;
            *(undefined1 *)((long)&pMVar19->temp_ops + (long)(pcVar14->env + -1)) = 0x5c;
            pVVar23 = (VARR_char *)(ulong)*(byte *)&varr->ctx;
          }
          else if (bVar30 == 0) {
            __ptr_00 = (void *)pcVar24->env[0].__jmpbuf[0];
            if (__ptr_00 != (void *)0x0) {
              pMVar19 = pcVar24->ctx;
              pMVar20 = (MIR_context_t)((long)&pMVar19->gen_ctx + 1);
              if ((MIR_context_t)pcVar24->options < pMVar20) {
                __size = (c2mir_options *)((long)&pMVar20->gen_ctx + ((ulong)pMVar20 >> 1));
                pVStack_78 = (VARR_char *)0x1900f6;
                __ptr_00 = realloc(__ptr_00,(size_t)__size);
                pcVar24->env[0].__jmpbuf[0] = (long)__ptr_00;
                pcVar24->options = __size;
                pMVar19 = pcVar24->ctx;
                pMVar20 = (MIR_context_t)((long)&pMVar19->gen_ctx + 1);
              }
              pcVar24->ctx = pMVar20;
              *(undefined1 *)((long)__ptr_00 + (long)pMVar19) = 0x22;
              return;
            }
            goto LAB_00190126;
          }
          pcVar14 = (c2m_ctx_t)pcVar24->env[0].__jmpbuf[0];
          if (pcVar14 == (c2m_ctx_t)0x0) break;
          pMVar19 = pcVar24->ctx;
          pMVar20 = (MIR_context_t)((long)&pMVar19->gen_ctx + 1);
          if ((MIR_context_t)pcVar24->options < pMVar20) {
            pcVar28 = (c2m_ctx_t)((long)&pMVar20->gen_ctx + ((ulong)pMVar20 >> 1));
            pVStack_78 = (VARR_char *)0x1900ae;
            pcVar12 = pcVar28;
            c2m_ctx_00 = pcVar14;
            pcVar14 = (c2m_ctx_t)realloc(pcVar14,(size_t)pcVar28);
            pcVar24->env[0].__jmpbuf[0] = (long)pcVar14;
            pcVar24->options = (c2mir_options *)pcVar28;
            pMVar19 = pcVar24->ctx;
            pMVar20 = (MIR_context_t)((long)&pMVar19->gen_ctx + 1);
          }
          pcVar24->ctx = pMVar20;
          *(char *)((long)&pMVar19->temp_ops + (long)(pcVar14->env + -1)) = (char)pVVar23;
          varr = (c2m_ctx_t)((long)&varr->ctx + 1);
        }
        pVStack_78 = (VARR_char *)0x19011c;
        stringify_cold_3();
LAB_0019011c:
        pVStack_78 = (VARR_char *)0x190121;
        stringify_cold_1();
      }
      pVStack_78 = (VARR_char *)0x190126;
      stringify_cold_4();
LAB_00190126:
      pVStack_78 = (VARR_char *)pptoken2token;
      stringify_cold_2();
      uVar17 = *(uint *)&pcVar12->ctx;
      uVar9 = (uVar17 & 0xffff) - 0x13d;
      pcStack_a0 = pcVar11;
      pVStack_98 = unaff_R12;
      pVStack_90 = unaff_R13;
      pcStack_88 = pcVar31;
      pcStack_80 = pcVar28;
      pVStack_78 = pVVar23;
      if (uVar9 < 0xb) {
        if (uVar9 == 2) {
          uVar17 = uVar17 & 0xffff0103;
          *(uint *)&pcVar12->ctx = uVar17;
        }
        else if ((0x7f3U >> (uVar9 & 0x1f) & 1) != 0) {
          __assert_fail("t->code != T_HEADER && t->code != T_BOA && t->code != T_EOA && t->code != T_EOR && t->code != T_EOP && t->code != T_EOFILE && t->code != T_EOU && t->code != T_PLM && t->code != T_RDBLNO"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x732,"token_t pptoken2token(c2m_ctx_t, token_t, int)");
        }
      }
      iVar18 = uVar17 << 0x10;
      if (extraout_EDX != 0 && iVar18 == 0x1030000) {
        pcVar29 = (char *)pcVar12->env[0].__jmpbuf[3];
        sVar15 = strlen(pcVar29);
        str_add(&tStack_c0,c2m_ctx_00,pcVar29,sVar15 + 1,0x102,0,0);
        if (tStack_c0.key == 0x102) {
          return;
        }
        *(short *)&pcVar12->ctx = (short)tStack_c0.key;
        *(undefined4 *)(pcVar12->env[0].__jmpbuf + 1) = 0;
        pcVar12->env[0].__jmpbuf[2] = 0;
        return;
      }
      if (iVar18 == 0xa0000) {
        return;
      }
      if (iVar18 == 0x200000) {
        return;
      }
      if (iVar18 != 0x1000000) {
        return;
      }
      pcVar29 = (char *)pcVar12->env[0].__jmpbuf[3];
      sVar15 = strlen(pcVar29);
      uVar17 = (uint)sVar15;
      if ((int)uVar17 < 1) {
        __assert_fail("last >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x746,"token_t pptoken2token(c2m_ctx_t, token_t, int)");
      }
      bVar34 = false;
      pcVar21 = pcVar29;
      if (*pcVar29 == '0') {
        bVar30 = pcVar29[1];
        bVar5 = true;
        iStack_cc = 0x10;
        bVar8 = 0;
        if (bVar30 < 0x62) {
          if (bVar30 == 0x42) {
LAB_0019026d:
            pcVar27 = error;
            if (c2m_ctx_00->options->pedantic_p == 0) {
              pcVar27 = warning;
            }
            bVar5 = false;
            (*pcVar27)(c2m_ctx_00,pcVar12->options,pcVar12->env[0].__jmpbuf[0],
                       "binary number is not a standard: %s",pcVar29);
            bVar8 = 1;
            iStack_cc = 2;
            pcVar21 = pcVar29 + 2;
          }
          else {
            bVar8 = 0;
            if (bVar30 != 0x58) {
LAB_001905dd:
              iStack_cc = 8;
              goto LAB_00190253;
            }
          }
        }
        else if (bVar30 != 0x78) {
          if (bVar30 != 0x62) goto LAB_001905dd;
          goto LAB_0019026d;
        }
      }
      else {
        iStack_cc = 10;
LAB_00190253:
        bVar8 = 1;
        bVar5 = false;
      }
      uStack_d0 = uVar17 - 1;
      uVar22 = 0;
      do {
        bVar30 = pcVar29[uVar22];
        if (bVar30 < 0x65) {
          if ((bVar30 == 0x2e) || (bVar30 == 0x50)) goto LAB_001902f5;
LAB_001902e8:
          if ((bool)(bVar8 & bVar30 == 0x45)) goto LAB_001902f5;
        }
        else {
          if (bVar30 == 0x65) {
            if (bVar5) goto LAB_001902fb;
          }
          else if (bVar30 != 0x70) goto LAB_001902e8;
LAB_001902f5:
          bVar34 = true;
        }
LAB_001902fb:
        uVar22 = uVar22 + 1;
      } while ((uVar17 & 0x7fffffff) != uVar22);
      if ((int)uVar17 < 3) {
        if (uVar17 == 1) goto LAB_0019040b;
LAB_00190455:
        uVar22 = (ulong)(uVar17 - 2);
        cVar1 = pcVar29[uVar22];
        if (cVar1 == 'L') {
          if ((pcVar29[uVar22 + 1] == 'L') && (pcVar29[uVar22 + 2] == '\0')) {
LAB_0019069f:
            iVar18 = 1;
            bVar5 = true;
            bVar30 = 0;
            iVar25 = -3;
            piStack_d8._0_4_ = 0;
            iStack_dc = 0;
            bVar8 = 1;
            goto LAB_0019072c;
          }
          bVar6 = false;
          bVar5 = false;
          if (pcVar29[uVar22 + 1] != 'U') goto LAB_001906c4;
          if (pcVar29[uVar22 + 2] != '\0') {
            bVar6 = false;
            goto LAB_0019069b;
          }
LAB_0019071b:
          piStack_d8._0_4_ = 1;
          bVar5 = false;
          bVar30 = 1;
          iVar25 = -3;
          iStack_dc = 1;
LAB_00190728:
          bVar8 = 0;
          iVar18 = 0;
          goto LAB_0019072c;
        }
        if (cVar1 == 'U') {
          if (pcVar29[uVar22 + 1] == 'L') {
            if (pcVar29[uVar22 + 2] != '\0') {
              bVar6 = true;
LAB_0019069b:
              bVar5 = false;
              goto LAB_001906c4;
            }
          }
          else {
LAB_001906f6:
            if ((pcVar29[uVar22 + 1] != 'l') || (pcVar29[uVar22 + 2] != '\0')) goto LAB_0019040b;
          }
          goto LAB_0019071b;
        }
        if (cVar1 != 'u') {
          if (cVar1 != 'l') goto LAB_0019040b;
          if ((pcVar29[uVar22 + 1] == 'l') && (pcVar29[uVar22 + 2] == '\0')) goto LAB_0019069f;
          bVar6 = false;
          if (pcVar29[uVar22 + 1] == 'u') {
            bVar5 = true;
            if (pcVar29[uVar22 + 2] == '\0') goto LAB_0019071b;
            bVar6 = false;
          }
          else {
            bVar5 = true;
          }
LAB_001906c4:
          if (((cVar1 != 'L') || (pcVar29[uVar22 + 1] != 'u')) || (pcVar29[uVar22 + 2] != '\0'))
          goto LAB_001906d9;
          goto LAB_0019071b;
        }
        if ((pcVar29[uVar22 + 1] == 'l') && (pcVar29[uVar22 + 2] == '\0')) goto LAB_0019071b;
        iVar18 = 0;
        bVar6 = false;
        bVar5 = false;
        if (pcVar29[uVar22 + 1] == 'L') {
          if (pcVar29[uVar22 + 2] == '\0') {
            piStack_d8._0_4_ = 1;
            bVar30 = 1;
            iVar25 = -3;
            bVar5 = false;
            iStack_dc = 1;
            bVar8 = 0;
            goto LAB_0019072c;
          }
        }
        else {
LAB_001906d9:
          if (((bVar5) && (pcVar29[uVar22 + 1] == 'U')) && (pcVar29[uVar22 + 2] == '\0'))
          goto LAB_0019071b;
          if (bVar6) goto LAB_001906f6;
        }
LAB_0019040b:
        bVar30 = pcVar29[uStack_d0];
        if (0x6b < bVar30) {
          if (bVar30 == 0x6c) goto LAB_001904da;
          if (bVar30 != 0x75) goto LAB_001904e6;
          if (pcVar29[(ulong)uStack_d0 + 1] == '\0') goto LAB_001905ea;
          if (!bVar34) goto LAB_001905d0;
          goto LAB_001907b3;
        }
        if (bVar30 == 0x4c) {
LAB_001904da:
          if (pcVar29[(ulong)uStack_d0 + 1] != '\0') goto LAB_001904e6;
          iStack_dc = 1;
          bVar30 = 0;
          iVar25 = -2;
          piStack_d8._0_4_ = 0;
          bVar5 = false;
          goto LAB_00190728;
        }
        if ((bVar30 == 0x55) && (pcVar29[(ulong)uStack_d0 + 1] == '\0')) {
LAB_001905ea:
          iStack_dc = 0;
          piStack_d8._0_4_ = 1;
          bVar30 = 1;
          iVar25 = -2;
          bVar5 = true;
          goto LAB_00190728;
        }
LAB_001904e6:
        if (bVar34) {
          if (((bVar30 == 0x66) || (bVar30 == 0x46)) && (pcVar29[(ulong)uStack_d0 + 1] == '\0')) {
            uStack_d0 = uVar17 - 2;
            piStack_d8 = __errno_location();
            *piStack_d8 = 0;
            fVar35 = strtof(pcVar21,(char **)&tStack_c0);
            pVar4 = *(pos_t *)&pcVar12->options;
            n = new_node(c2m_ctx_00,N_F);
            add_pos(c2m_ctx_00,n,pVar4);
            bVar30 = 1;
            bVar7 = 0;
            bVar8 = 0;
            (n->u).f = fVar35;
            goto LAB_0019084f;
          }
          goto LAB_001907b3;
        }
LAB_001905d0:
        piStack_d8._0_4_ = 0;
        iStack_dc = 0;
        iVar18 = 0;
LAB_0019076b:
        piVar16 = __errno_location();
        *piVar16 = 0;
        n = get_int_node_from_repr
                      (c2m_ctx_00,pcVar21,(char **)&tStack_c0,iStack_cc,(int)piStack_d8,iStack_dc,
                       iVar18,*(pos_t *)&pcVar12->options);
        bVar7 = 0;
        piStack_d8 = piVar16;
LAB_0019084b:
        bVar8 = 0;
      }
      else {
        __s1 = pcVar29 + (uVar17 - 3);
        iVar18 = strcmp(__s1,"LLU");
        bVar30 = 1;
        iVar25 = -4;
        iStack_dc = 0;
        piStack_d8._0_4_ = 1;
        if (iVar18 == 0) {
          bVar5 = true;
          bVar8 = 1;
          iVar18 = 1;
        }
        else {
          iVar18 = strcmp(__s1,"ULL");
          if ((((iVar18 == 0) || (iVar18 = strcmp(__s1,"llu"), iVar18 == 0)) ||
              (iVar18 = strcmp(__s1,"ull"), iVar18 == 0)) ||
             (((iVar18 = strcmp(__s1,"LLu"), iVar18 == 0 ||
               (iVar18 = strcmp(__s1,"uLL"), iVar18 == 0)) ||
              (iVar18 = strcmp(__s1,"llU"), iVar18 == 0)))) {
            bVar5 = true;
            bVar8 = 1;
            iVar18 = 1;
            bVar30 = 1;
            iVar25 = -4;
          }
          else {
            iVar10 = strcmp(__s1,"Ull");
            bVar5 = true;
            bVar8 = 1;
            iVar18 = 1;
            bVar30 = 1;
            iVar25 = -4;
            if (iVar10 != 0) goto LAB_00190455;
          }
        }
LAB_0019072c:
        uStack_d0 = iVar25 + uVar17;
        if (!bVar34) goto LAB_0019076b;
        if (!(bool)(bVar30 | bVar8)) {
          if (bVar5) goto LAB_001907b3;
          piStack_d8 = __errno_location();
          *piStack_d8 = 0;
          strtold(pcVar21,(char **)&tStack_c0);
          n = new_ld_node(c2m_ctx_00,in_ST0,*(pos_t *)&pcVar12->options);
          bVar7 = 1;
          goto LAB_0019084b;
        }
        error(c2m_ctx_00,0x1c11e6,(char *)pcVar12->options,pcVar12->env[0].__jmpbuf[0],pcVar29);
LAB_001907b3:
        piStack_d8 = __errno_location();
        *piStack_d8 = 0;
        dVar36 = strtod(pcVar21,(char **)&tStack_c0);
        pVar4 = *(pos_t *)&pcVar12->options;
        n = new_node(c2m_ctx_00,N_D);
        add_pos(c2m_ctx_00,n,pVar4);
        bVar8 = 1;
        bVar7 = 0;
        (n->u).d = dVar36;
      }
      bVar30 = 0;
LAB_0019084f:
      pcVar12->env[0].__jmpbuf[2] = (long)n;
      if (tStack_c0.str.s == pcVar29 + (long)(int)uStack_d0 + 1) {
        if (*piStack_d8 != 0) {
          if ((bool)(bVar7 | bVar8 | bVar30)) {
            warning(c2m_ctx_00,0x1c1201,(char *)pcVar12->options,pcVar12->env[0].__jmpbuf[0],
                    pcVar12->env[0].__jmpbuf[3]);
          }
          else {
            pcVar27 = error;
            if (c2m_ctx_00->options->pedantic_p == 0) {
              pcVar27 = warning;
            }
            (*pcVar27)(c2m_ctx_00,pcVar12->options,pcVar12->env[0].__jmpbuf[0],
                       "number %s is out of range",pcVar12->env[0].__jmpbuf[3]);
          }
        }
      }
      else {
        __stream = (FILE *)c2m_ctx_00->options->message_file;
        if (__stream != (FILE *)0x0) {
          fprintf(__stream,"%s:%s:%s\n",pcVar29);
        }
        error(c2m_ctx_00,0x1c11e6,(char *)pcVar12->options,pcVar12->env[0].__jmpbuf[0],
              pcVar12->env[0].__jmpbuf[3]);
      }
      return;
    }
    if (uVar17 != 0x75) {
      pcVar24 = (c2m_ctx_t)pcVar11->env[0].__jmpbuf[3];
      pVVar23 = (VARR_char *)0x0;
      bVar34 = false;
      varr = (c2m_ctx_t)CONCAT71(uVar26,*(char *)&pcVar24->ctx);
      goto LAB_0018fbca;
    }
    if (pbVar13[1] != 0x38) goto LAB_0018fb86;
    pcVar24 = (c2m_ctx_t)pcVar11->env[0].__jmpbuf[3];
    pVVar23 = (VARR_char *)&DAT_00000002;
    bVar8 = *(byte *)&pcVar24->ctx;
    varr = (c2m_ctx_t)(ulong)bVar8;
    if (bVar8 == 0x22) goto LAB_0018fb98;
    if (bVar8 != 0x75) {
      bVar34 = true;
      goto LAB_0018fbca;
    }
LAB_0018fbe4:
    varr = (c2m_ctx_t)CONCAT71((int7)((ulong)varr >> 8),0x75);
    if (*(char *)((long)&pcVar24->ctx + 1) == '8') {
      pcVar24 = (c2m_ctx_t)0x0;
      local_40 = 2;
      if ((uVar17 != 0x22) && ((uVar17 != 0x75 || (bVar30 = 0x75, pbVar13[1] != 0x38)))) {
LAB_0018fc48:
        pcVar24 = (c2m_ctx_t)((pos_t *)&pcVar11->options)->fname;
        pVStack_50 = (VARR_char *)0x18fc61;
        varr = c2m_ctx;
        error(c2m_ctx,0x1c1066,(char *)pcVar24,pcVar11->env[0].__jmpbuf[0]);
        pbVar13 = (byte *)pcVar31->env[0].__jmpbuf[3];
        bVar30 = *pbVar13;
        goto LAB_0018fc67;
      }
    }
    else {
LAB_0018fc0b:
      if (bVar30 != 0x22) {
        pcVar24 = (c2m_ctx_t)&DAT_00000001;
        local_40 = 1;
        if (((byte)varr != bVar30) || (local_40 = 1, pbVar13[1] == 0x38)) goto LAB_0018fc48;
        goto LAB_0018fc67;
      }
      bVar30 = 0x22;
      local_40 = 1;
    }
LAB_0018fc74:
    pcVar29 = (char *)pcVar11->env[0].__jmpbuf[3];
    local_44 = 0x4c;
    cVar1 = *pcVar29;
    pcVar24 = (c2m_ctx_t)CONCAT71((int7)((ulong)pcVar24 >> 8),cVar1);
    if (((cVar1 == 'L') || (local_44 = 0x55, bVar30 == 0x55)) || (cVar1 == 'U')) goto LAB_0018fc8c;
    if (bVar30 == 0x75) {
      if (pbVar13[1] == 0x38) {
LAB_0018ff02:
        varr = (c2m_ctx_t)c2m_ctx->temp_string;
        pcVar24 = (c2m_ctx_t)0x75;
        pVStack_50 = (VARR_char *)0x18ff13;
        VARR_charpush((VARR_char *)varr,'u');
        local_44 = 0x38;
      }
      else {
        local_44 = 0x75;
        if (cVar1 == 'u') goto LAB_0018fef8;
      }
      goto LAB_0018fc8c;
    }
    local_44 = 0x20;
    if (cVar1 == 'u') {
LAB_0018fef8:
      local_44 = 0x75;
      if (pcVar29[1] == '8') goto LAB_0018ff02;
      goto LAB_0018fc8c;
    }
LAB_0018fce6:
    pcVar28 = (c2m_ctx_t)(pcVar11->env[0].__jmpbuf + 3);
    bVar30 = pbVar13[(long)pVVar23];
    local_38 = pcVar28;
    if (bVar30 != 0) {
      pVVar23 = (VARR_char *)((undefined1 *)((long)&pVVar23->els_num + 1) + (long)pbVar13);
      do {
        pcVar28 = (c2m_ctx_t)c2m_ctx->temp_string;
        pcVar11 = (c2m_ctx_t)pcVar28->env[0].__jmpbuf[0];
        if (pcVar11 == (c2m_ctx_t)0x0) {
          pVStack_50 = (VARR_char *)0x18ff56;
          pre_out_cold_1();
          goto LAB_0018ff56;
        }
        pMVar19 = pcVar28->ctx;
        pMVar20 = (MIR_context_t)((long)&pMVar19->gen_ctx + 1);
        if ((MIR_context_t)pcVar28->options < pMVar20) {
          pcVar12 = (c2m_ctx_t)((long)&pMVar20->gen_ctx + ((ulong)pMVar20 >> 1));
          pVStack_50 = (VARR_char *)0x18fd29;
          pcVar24 = pcVar12;
          varr = pcVar11;
          pcVar11 = (c2m_ctx_t)realloc(pcVar11,(size_t)pcVar12);
          pcVar28->env[0].__jmpbuf[0] = (long)pcVar11;
          pcVar28->options = (c2mir_options *)pcVar12;
          pMVar19 = pcVar28->ctx;
          pMVar20 = (MIR_context_t)((long)&pMVar19->gen_ctx + 1);
        }
        pcVar28->ctx = pMVar20;
        *(byte *)((long)&pMVar19->temp_ops + (long)(pcVar11->env + -1)) = bVar30;
        bVar30 = (byte)pVVar23->els_num;
        pVVar23 = (VARR_char *)((long)&pVVar23->els_num + 1);
      } while (bVar30 != 0);
    }
    unaff_R12 = c2m_ctx->temp_string;
    if (((unaff_R12 == (VARR_char *)0x0) || (unaff_R12->varr == (char *)0x0)) ||
       (sVar33 = unaff_R12->els_num, sVar33 == 0)) goto LAB_0018ff65;
    if (unaff_R12->varr[sVar33 - 1] != '\"') goto LAB_0018ff79;
    unaff_R12->els_num = sVar33 - 1;
    cVar1 = *(char *)((long)&local_38->ctx->gen_ctx + local_40 + 1);
    unaff_R13 = (VARR_char *)CONCAT71((int7)((ulong)unaff_R13 >> 8),cVar1);
    if (cVar1 == '\0') {
LAB_0018fe0e:
      pcVar11 = (c2m_ctx_t)unaff_R12->varr;
      if ((pcVar11 != (c2m_ctx_t)0x0) && (sVar33 = unaff_R12->els_num, sVar33 != 0)) {
        if (*(char *)((long)pcVar11->env[0].__jmpbuf + (sVar33 - 0x11)) != '\"') {
          pVStack_50 = (VARR_char *)0x18ffb7;
          __assert_fail("VARR_LAST (char, temp_string) == \'\"\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0xf07,"void pre_out(c2m_ctx_t, token_t)");
        }
        uVar22 = sVar33 + 1;
        if (unaff_R12->size < uVar22) {
          pcVar28 = (c2m_ctx_t)((uVar22 >> 1) + uVar22);
          pVStack_50 = (VARR_char *)0x18fe53;
          pcVar24 = pcVar28;
          varr = pcVar11;
          pcVar11 = (c2m_ctx_t)realloc(pcVar11,(size_t)pcVar28);
          unaff_R12->varr = (char *)pcVar11;
          unaff_R12->size = (size_t)pcVar28;
          sVar33 = unaff_R12->els_num;
          uVar22 = sVar33 + 1;
        }
        unaff_R12->els_num = uVar22;
        *(undefined1 *)((long)pcVar11->env[0].__jmpbuf + (sVar33 - 0x10)) = 0;
        if (c2m_ctx->temp_string != (VARR_char *)0x0) {
          pVStack_50 = (VARR_char *)0x18fe89;
          sVar37 = uniq_cstr(c2m_ctx,c2m_ctx->temp_string->varr);
          pcVar31->env[0].__jmpbuf[3] = (long)sVar37.s;
          pVStack_50 = (VARR_char *)0x18fea3;
          set_string_val(c2m_ctx,(token_t)pcVar31,c2m_ctx->temp_string,local_44);
          pcVar11 = pcVar31;
          goto LAB_0018fb27;
        }
        pVStack_50 = (VARR_char *)0x18ffbc;
        pre_out_cold_3();
        goto LAB_0018ffbc;
      }
    }
    else {
      pcVar29 = (char *)((long)&local_38->ctx->gen_ctx + local_40 + 2);
      do {
        pVVar23 = c2m_ctx->temp_string;
        pcVar11 = (c2m_ctx_t)pVVar23->varr;
        if (pcVar11 == (c2m_ctx_t)0x0) goto LAB_0018ff56;
        sVar33 = pVVar23->els_num;
        uVar22 = sVar33 + 1;
        if (pVVar23->size < uVar22) {
          pcVar28 = (c2m_ctx_t)((uVar22 >> 1) + uVar22);
          pVStack_50 = (VARR_char *)0x18fdda;
          pcVar24 = pcVar28;
          varr = pcVar11;
          pcVar11 = (c2m_ctx_t)realloc(pcVar11,(size_t)pcVar28);
          pVVar23->varr = (char *)pcVar11;
          pVVar23->size = (size_t)pcVar28;
          sVar33 = pVVar23->els_num;
          uVar22 = sVar33 + 1;
        }
        pVVar23->els_num = uVar22;
        *(char *)((long)pcVar11->env[0].__jmpbuf + (sVar33 - 0x10)) = (char)unaff_R13;
        cVar1 = *pcVar29;
        unaff_R13 = (VARR_char *)CONCAT71((int7)((ulong)unaff_R13 >> 8),cVar1);
        pcVar29 = pcVar29 + 1;
      } while (cVar1 != '\0');
      unaff_R12 = c2m_ctx->temp_string;
      if (unaff_R12 != (VARR_char *)0x0) goto LAB_0018fe0e;
    }
    goto LAB_0018ff6a;
  }
  goto LAB_0018ff74;
LAB_0018ff56:
  pVStack_50 = (VARR_char *)0x18ff5b;
  pre_out_cold_2();
LAB_0018ff5b:
  pVStack_50 = (VARR_char *)0x18ff60;
  pre_out_cold_10();
LAB_0018ff60:
  pVStack_50 = (VARR_char *)0x18ff65;
  pre_out_cold_9();
LAB_0018ff65:
  pVStack_50 = (VARR_char *)0x18ff6a;
  pre_out_cold_5();
LAB_0018ff6a:
  pVStack_50 = (VARR_char *)0x18ff6f;
  pre_out_cold_4();
LAB_0018ff6f:
  pVStack_50 = (VARR_char *)0x18ff74;
  pre_out_cold_8();
LAB_0018ff74:
  pVStack_50 = (VARR_char *)0x18ff79;
  pre_out_cold_7();
LAB_0018ff79:
  pVStack_50 = (VARR_char *)0x18ff98;
  __assert_fail("VARR_LAST (char, temp_string) == \'\"\'",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0xf03,"void pre_out(c2m_ctx_t, token_t)");
}

Assistant:

static void pre_out (c2m_ctx_t c2m_ctx, token_t t) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;

  if (t == NULL) {
    t = new_token (c2m_ctx, pre_last_token == NULL ? no_pos : pre_last_token->pos, "<EOF>",
                   T_EOFILE, N_IGNORE);
  } else {
    assert (t->code != T_EOU && t->code != EOF);
    pre_last_token = t;
    if ((t = pptoken2token (c2m_ctx, t, TRUE)) == NULL) return;
  }
  if (t->code == T_STR && VARR_LENGTH (token_t, recorded_tokens) != 0
      && VARR_LAST (token_t, recorded_tokens)->code == T_STR) { /* concat strings */
    token_t last_t = VARR_POP (token_t, recorded_tokens);
    int type = ' ', last_t_quot_off = 0, t_quot_off = 0, err_p = FALSE;
    const char *s;

    VARR_TRUNC (char, temp_string, 0);
    if (last_t->repr[0] == 'u' && last_t->repr[1] == '8') {
      err_p = t->repr[0] != '\"' && (t->repr[0] != 'u' || t->repr[1] != '8');
      last_t_quot_off = 2;
    } else if (last_t->repr[0] == 'L' || last_t->repr[0] == 'u' || last_t->repr[0] == 'U') {
      err_p = t->repr[0] != '\"' && (t->repr[0] != last_t->repr[0] || t->repr[1] == '8');
      last_t_quot_off = 1;
    }
    if (t->repr[0] == 'u' && t->repr[1] == '8') {
      err_p = last_t->repr[0] != '\"' && (last_t->repr[0] != 'u' || last_t->repr[1] != '8');
      t_quot_off = 2;
    } else if (t->repr[0] == 'L' || t->repr[0] == 'u' || t->repr[0] == 'U') {
      err_p = last_t->repr[0] != '\"' && (t->repr[0] != last_t->repr[0] || last_t->repr[1] == '8');
      t_quot_off = 1;
    }
    if (err_p) error (c2m_ctx, t->pos, "concatenation of different type string literals");
    if (sizeof (mir_wchar) == 4 && (last_t->repr[0] == 'L' || t->repr[0] == 'L')) {
      type = 'L';
    } else if (last_t->repr[0] == 'U' || t->repr[0] == 'U') {
      type = 'U';
    } else if (last_t->repr[0] == 'L' || t->repr[0] == 'L') {
      type = 'L';
    } else if ((last_t->repr[0] == 'u' && last_t->repr[1] == '8')
               || (t->repr[0] == 'u' && t->repr[1] == '8')) {
      VARR_PUSH (char, temp_string, 'u');
      type = '8';
    } else if ((last_t->repr[0] == 'u' || t->repr[0] == 'u')) {
      type = 'u';
    }
    if (type != ' ') VARR_PUSH (char, temp_string, type);
    for (s = last_t->repr + last_t_quot_off; *s != 0; s++) VARR_PUSH (char, temp_string, *s);
    assert (VARR_LAST (char, temp_string) == '"');
    VARR_POP (char, temp_string);
    for (s = t->repr + t_quot_off + 1; *s != 0; s++) VARR_PUSH (char, temp_string, *s);
    t = last_t;
    assert (VARR_LAST (char, temp_string) == '"');
    VARR_PUSH (char, temp_string, '\0');
    t->repr = uniq_cstr (c2m_ctx, VARR_ADDR (char, temp_string)).s;
    set_string_val (c2m_ctx, t, temp_string, type);
  }
  VARR_PUSH (token_t, recorded_tokens, t);
}